

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

void jsoncons::detail::dump_buffer<jsoncons::string_sink<std::__cxx11::string>>
               (char *buffer,size_t length,char decimal_point,
               string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *result)

{
  byte ch;
  uint uVar1;
  bool bVar2;
  byte *pbVar3;
  char *q;
  
  if (length != 0) {
    pbVar3 = (byte *)(buffer + length);
    bVar2 = true;
    for (; buffer < pbVar3; buffer = (char *)((byte *)buffer + 1)) {
      ch = *buffer;
      uVar1 = ch - 0x2b;
      if (uVar1 < 0x3b) {
        if ((0x7fe5UL >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
          if ((0x400000004000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_0018c1bc;
          ch = 0x65;
          goto LAB_0018c1b7;
        }
LAB_0018c195:
        string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::push_back(result,ch);
      }
      else {
LAB_0018c1bc:
        if (ch == decimal_point) {
          ch = 0x2e;
LAB_0018c1b7:
          bVar2 = false;
          goto LAB_0018c195;
        }
      }
    }
    if (bVar2) {
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(result,'.');
      string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::push_back(result,'0');
      return;
    }
  }
  return;
}

Assistant:

void dump_buffer(const char *buffer, std::size_t length, char decimal_point, Result& result)
    {
        const char *sbeg = buffer;
        const char *send = sbeg + length;

        if (sbeg != send)
        {
            bool needs_dot = true;
            for (const char* q = sbeg; q < send; ++q)
            {
                switch (*q)
                {
                case '-':
                case '0':
                case '1':
                case '2':
                case '3':
                case '4':
                case '5':
                case '6':
                case '7':
                case '8':
                case '9':
                case '+':
                    result.push_back(*q);
                    break;
                case 'e':
                case 'E':
                    result.push_back('e');
                    needs_dot = false;
                    break;
                default:
                    if (*q == decimal_point)
                    {
                        needs_dot = false;
                        result.push_back('.');
                    }
                    break;
                }
            }
            if (needs_dot)
            {
                result.push_back('.');
                result.push_back('0');
            }
        }
    }